

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O1

void __thiscall
EnvTestingSetup::EnvTestingSetup(EnvTestingSetup *this,ChainType chainType,TestOpts opts)

{
  long lVar1;
  TestOpts opts_00;
  Logger *pLVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDX;
  long in_FS_OFFSET;
  pointer in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffffb8,in_RDX)
  ;
  opts_00._29_3_ = (int3)((uint)in_stack_ffffffffffffffd4 >> 8);
  opts_00.min_validation_cache =
       (bool)*(undefined1 *)
              ((long)&in_RDX[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + 4);
  opts_00.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = in_stack_ffffffffffffffc0;
  opts_00.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = in_stack_ffffffffffffffb8;
  opts_00.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffc8;
  opts_00._24_4_ =
       *(undefined4 *)
        &in_RDX[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  BasicTestingSetup::BasicTestingSetup(&this->super_BasicTestingSetup,chainType,opts_00);
  if (in_stack_ffffffffffffffb8 != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffffb8,
                    (long)in_stack_ffffffffffffffc8 - (long)in_stack_ffffffffffffffb8);
  }
  pLVar2 = LogInstance();
  this->m_prev_log_level = (pLVar2->m_log_level)._M_i;
  std::function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>::function
            (&this->m_create_sock_orig,&CreateSock);
  pLVar2 = LogInstance();
  LOCK();
  (pLVar2->m_log_level)._M_i = Trace;
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit EnvTestingSetup(const ChainType chainType = ChainType::MAIN,
                             TestOpts opts = {})
        : BasicTestingSetup{chainType, opts},
          m_prev_log_level{LogInstance().LogLevel()},
          m_create_sock_orig{CreateSock}
    {
        LogInstance().SetLogLevel(BCLog::Level::Trace);
    }